

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::GatherGLSLCompile::Uniforms_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "uniform mediump sampler2D tex_2d;                  \nuniform mediump isamplerCube itex_cube;            \nuniform mediump usampler2DArray utex_2da;          \nuniform mediump sampler2DShadow tex_2ds;           \nuniform mediump samplerCubeShadow tex_cubes;       \nuniform mediump sampler2DArrayShadow tex_2das;     \n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Uniforms()
	{
		return "uniform mediump sampler2D tex_2d;                  \n"
			   "uniform mediump isamplerCube itex_cube;            \n"
			   "uniform mediump usampler2DArray utex_2da;          \n"
			   ""
			   "uniform mediump sampler2DShadow tex_2ds;           \n"
			   "uniform mediump samplerCubeShadow tex_cubes;       \n"
			   "uniform mediump sampler2DArrayShadow tex_2das;     \n";
	}